

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakePathCommand.cxx
# Opt level: O2

OutputVariable * __thiscall
anon_unknown.dwarf_2f51d5::ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable>::
Parse<2>(OutputVariable *__return_storage_ptr__,
        ArgumentParserWithOutputVariable<(anonymous_namespace)::OutputVariable> *this,
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *args)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  _Rb_tree_header *p_Var1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_98;
  Instance local_88;
  
  this_00 = &(this->super_CMakePathArgumentParser<(anonymous_namespace)::OutputVariable>).Inputs;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::clear(this_00);
  local_98.End._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
  local_98.Begin._M_current =
       (args->
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       )._M_impl.super__Vector_impl_data._M_start + 2;
  (__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_color = _S_red;
  (__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_parent = (_Base_ptr)0x0;
  p_Var1 = &(__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.
            super__Rb_tree_header;
  (__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_left = &p_Var1->_M_header;
  (__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_header._M_right = &p_Var1->_M_header;
  (__return_storage_ptr__->super_ParseResult).KeywordErrors._M_t._M_impl.super__Rb_tree_header.
  _M_node_count = 0;
  (__return_storage_ptr__->Output).
  super__Optional_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_false>
  ._M_payload.
  super__Optional_payload<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_false,_false>
  .
  super__Optional_payload_base<ArgumentParser::NonEmpty<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_engaged = false;
  local_88.Keyword._M_len = 0;
  local_88.Keyword._M_str = (char *)0x0;
  local_88.KeywordValuesSeen = 0;
  local_88.KeywordValuesExpected = 0;
  local_88.KeywordValueFunc.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  local_88.KeywordValueFunc.super__Function_base._M_functor._8_8_ = 0;
  local_88.KeywordValueFunc.super__Function_base._M_manager = (_Manager_type)0x0;
  local_88.KeywordValueFunc._M_invoker = (_Invoker_type)0x0;
  local_88.DoneWithPositional = false;
  local_88.Bindings = (ActionMap *)this;
  local_88.ParseResults = &__return_storage_ptr__->super_ParseResult;
  local_88.UnparsedArguments = this_00;
  local_88.Result = __return_storage_ptr__;
  ArgumentParser::Instance::
  Parse<cmRange<__gnu_cxx::__normal_iterator<std::__cxx11::string_const*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            (&local_88,&local_98,0);
  std::_Function_base::~_Function_base(&local_88.KeywordValueFunc.super__Function_base);
  return __return_storage_ptr__;
}

Assistant:

Result Parse(std::vector<std::string> const& args) const
  {
    return this->CMakePathArgumentParser<Result>::template Parse<Advance>(
      args);
  }